

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O2

UBool __thiscall icu_63::NFSubstitution::operator==(NFSubstitution *this,NFSubstitution *rhs)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = std::type_info::operator==
                    ((type_info *)(this->super_UObject)._vptr_UObject[-1],
                     (type_info *)(rhs->super_UObject)._vptr_UObject[-1]);
  if (((bVar1) && (this->pos == rhs->pos)) &&
     ((this->ruleSet == (NFRuleSet *)0x0) != (rhs->ruleSet != (NFRuleSet *)0x0))) {
    if (this->numberFormat == (DecimalFormat *)0x0) {
      bVar1 = rhs->numberFormat == (DecimalFormat *)0x0;
    }
    else {
      iVar2 = (*(this->numberFormat->super_NumberFormat).super_Format.super_UObject._vptr_UObject[3]
              )();
      bVar1 = (char)iVar2 != '\0';
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

UBool
NFSubstitution::operator==(const NFSubstitution& rhs) const
{
  // compare class and all of the fields all substitutions have
  // in common
  // this should be called by subclasses before their own equality tests
  return typeid(*this) == typeid(rhs)
  && pos == rhs.pos
  && (ruleSet == NULL) == (rhs.ruleSet == NULL)
  // && ruleSet == rhs.ruleSet causes circularity, other checks to make instead?
  && (numberFormat == NULL
      ? (rhs.numberFormat == NULL)
      : (*numberFormat == *rhs.numberFormat));
}